

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O1

void __thiscall CTcDataStream::write_at(CTcDataStream *this,ulong ofs,char *buf,size_t len)

{
  ulong __n;
  
  if (this->ofs_ == ofs) {
    write(this,(int)buf,(void *)len,len);
  }
  if (this->ofs_ < len + ofs) {
    CTcTokenizer::throw_internal_error(0x2cee);
  }
  if (len != 0) {
    do {
      __n = 65000 - ofs % 65000;
      if (len <= __n) {
        __n = len;
      }
      memcpy(this->pages_[ofs / 65000] + ofs % 65000,buf,__n);
      ofs = ofs + __n;
      buf = buf + __n;
      len = len - __n;
    } while (len != 0);
  }
  return;
}

Assistant:

void CTcDataStream::write_at(ulong ofs, const char *buf, size_t len)
{
    /* if we're writing to the current offset, use the normal writer */
    if (ofs == ofs_)
        write(buf, len);
    
    /* 
     *   log an internal error, and skip writing anything, if the desired
     *   range of offsets has not been previously written 
     */
    if (ofs + len > ofs_)
        G_tok->throw_internal_error(TCERR_WRITEAT_PAST_END);

    /* write the data to each page it spans */
    while (len != 0)
    {
        size_t cur;

        /* 
         *   determine how much is left on the page containing the current
         *   starting offset 
         */
        cur = TCCS_PAGE_SIZE - (ofs % TCCS_PAGE_SIZE);

        /* 
         *   figure out how much we can copy - copy the whole remaining
         *   size, but no more than the amount remaining on this page 
         */
        if (cur > len)
            cur = len;

        /* copy the data */
        memcpy(calc_addr(ofs), buf, cur);

        /* advance past this chunk */
        len -= cur;
        ofs += cur;
        buf += cur;
    }
}